

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O2

int __thiscall xercesc_4_0::XMLDateTime::copy(XMLDateTime *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  XMLSize_t XVar1;
  int i;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  ulong uVar4;
  void *pvVar5;
  XMLCh *__dest;
  
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    this->fValue[lVar3] = *(int *)(dst + lVar3 * 4 + 8);
  }
  this->fMilliSecond = *(double *)(dst + 0x48);
  this->fHasTime = (bool)dst[0x50];
  this->fTimeZone[0] = *(int *)(dst + 0x28);
  this->fTimeZone[1] = *(int *)(dst + 0x2c);
  this->fStart = *(XMLSize_t *)(dst + 0x30);
  uVar4 = *(ulong *)(dst + 0x38);
  this->fEnd = uVar4;
  if (uVar4 != 0) {
    if (this->fBufferMaxLen < uVar4) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fBuffer);
      XVar1 = *(XMLSize_t *)(dst + 0x40);
      this->fBufferMaxLen = XVar1;
      iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar1 * 2 + 2);
      __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
      this->fBuffer = __dest;
      uVar4 = this->fEnd;
    }
    else {
      __dest = this->fBuffer;
    }
    pvVar5 = memcpy(__dest,*(void **)(dst + 0x58),uVar4 * 2 + 2);
    return (int)pvVar5;
  }
  return 0;
}

Assistant:

inline void XMLDateTime::copy(const XMLDateTime& rhs)
{
    for ( int i = 0; i < TOTAL_SIZE; i++ )
        fValue[i] = rhs.fValue[i];

    fMilliSecond   = rhs.fMilliSecond;
    fHasTime      = rhs.fHasTime;
    fTimeZone[hh] = rhs.fTimeZone[hh];
    fTimeZone[mm] = rhs.fTimeZone[mm];
    fStart = rhs.fStart;
    fEnd   = rhs.fEnd;

    if (fEnd > 0)
    {
        if (fEnd > fBufferMaxLen)
        {
            fMemoryManager->deallocate(fBuffer);//delete[] fBuffer;
            fBufferMaxLen = rhs.fBufferMaxLen;
            fBuffer = (XMLCh*) fMemoryManager->allocate((fBufferMaxLen+1) * sizeof(XMLCh));
        }

        memcpy(fBuffer, rhs.fBuffer, (fEnd+1) * sizeof(XMLCh));
    }
}